

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

void Abc_CexFreeP(Abc_Cex_t **p)

{
  Abc_Cex_t *__ptr;
  
  __ptr = *p;
  if (__ptr != (Abc_Cex_t *)0x0) {
    if (__ptr != (Abc_Cex_t *)0x1) {
      free(__ptr);
    }
    *p = (Abc_Cex_t *)0x0;
  }
  return;
}

Assistant:

void Abc_CexFreeP( Abc_Cex_t ** p )
{
    if ( *p == NULL )
        return;
    if ( *p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
        *p = NULL;
    else
        ABC_FREE( *p );
}